

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_texteditor(_glist *x)

{
  uint local_24;
  char *pcStack_20;
  int bufsize;
  char *buf;
  _rtext *foo;
  _glist *x_local;
  
  buf = (char *)x->gl_editor->e_textedfor;
  foo = (_rtext *)x;
  if ((_rtext *)buf == (_rtext *)0x0) {
    pcStack_20 = "";
    local_24 = 0;
  }
  else {
    rtext_gettext((_rtext *)buf,&stack0xffffffffffffffe0,(int *)&local_24);
  }
  pdgui_vmess("pdtk_pd_texteditor","p",(ulong)local_24,pcStack_20);
  return;
}

Assistant:

static void canvas_texteditor(t_canvas *x)
{
    t_rtext *foo;
    char *buf;
    int bufsize;
    if ((foo = x->gl_editor->e_textedfor))
        rtext_gettext(foo, &buf, &bufsize);
    else buf = "", bufsize = 0;
    pdgui_vmess("pdtk_pd_texteditor", "p", bufsize, buf);
}